

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTcpServer.cpp
# Opt level: O0

void __thiscall liblogger::LogTcpServer::LogTcpServer(LogTcpServer *this,int port)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 uVar5;
  LogException *this_00;
  string *message;
  undefined4 in_ESI;
  ILogger *in_RDI;
  exception *ex;
  stringstream ss_5;
  stringstream ss_4;
  stringstream ss_3;
  socklen_t sockaddr_len;
  sockaddr_in serv_addr;
  stringstream ss_2;
  socklen_t vallen;
  int value;
  stringstream ss_1;
  stringstream ss;
  string *in_stack_fffffffffffff518;
  LogException *in_stack_fffffffffffff520;
  stringstream local_a30 [16];
  ostream local_a20 [383];
  undefined1 local_8a1;
  stringstream local_880 [16];
  ostream local_870 [383];
  undefined1 local_6f1;
  stringstream local_6d0 [16];
  ostream local_6c0 [376];
  socklen_t local_548;
  sockaddr local_544;
  undefined1 local_531;
  stringstream local_510 [16];
  ostream local_500 [380];
  undefined4 local_384;
  undefined4 local_380;
  undefined1 local_379;
  stringstream local_358 [16];
  ostream local_348 [383];
  undefined1 local_1c9;
  stringstream local_198 [16];
  ostream local_188 [380];
  undefined4 local_c;
  
  local_c = in_ESI;
  ILogger::ILogger(in_RDI);
  in_RDI->_vptr_ILogger = (_func_int **)&PTR__LogTcpServer_001cc918;
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x1ac0b2);
  *(undefined4 *)&in_RDI[10]._vptr_ILogger = local_c;
  *(undefined4 *)((long)&in_RDI[10]._vptr_ILogger + 4) = 0xffffffff;
  *(undefined1 *)&in_RDI[0xc]._vptr_ILogger = 0;
  *(undefined4 *)&in_RDI[0xb]._vptr_ILogger = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0xb]._vptr_ILogger + 4) = 0xffffffff;
  iVar1 = pthread_mutex_init((pthread_mutex_t *)(in_RDI + 2),(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = socket(2,1,6);
  *(int *)((long)&in_RDI[10]._vptr_ILogger + 4) = iVar1;
  if (*(int *)((long)&in_RDI[10]._vptr_ILogger + 4) < 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = std::operator<<(local_188,"Cannot create socket: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    local_1c9 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    local_1c9 = 0;
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  iVar1 = socketpair(1,1,0,(int *)(in_RDI + 0xb));
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_358);
    poVar2 = std::operator<<(local_348,"Cannot create ctlfd: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    local_379 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    local_379 = 0;
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  local_380 = 1;
  local_384 = 4;
  iVar1 = setsockopt(*(int *)((long)&in_RDI[10]._vptr_ILogger + 4),1,2,&local_380,4);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_510);
    poVar2 = std::operator<<(local_500,"Cannot set SO_REUSEADDR on socket: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    local_531 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    local_531 = 0;
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  local_548 = 0x10;
  memset(&local_544,0,0x10);
  local_544.sa_family = 2;
  local_544.sa_data[2] = '\0';
  local_544.sa_data[3] = '\0';
  local_544.sa_data[4] = '\0';
  local_544.sa_data[5] = '\0';
  local_544.sa_data._0_2_ = htons((uint16_t)*(undefined4 *)&in_RDI[10]._vptr_ILogger);
  iVar1 = bind(*(int *)((long)&in_RDI[10]._vptr_ILogger + 4),&local_544,local_548);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_6d0);
    poVar2 = std::operator<<(local_6c0,"Cannot bind to port: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&in_RDI[10]._vptr_ILogger);
    poVar2 = std::operator<<(poVar2," error: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    local_6f1 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    local_6f1 = 0;
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  iVar1 = listen(*(int *)((long)&in_RDI[10]._vptr_ILogger + 4),0xf);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_880);
    poVar2 = std::operator<<(local_870,"Cannot listen on port: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&in_RDI[10]._vptr_ILogger);
    poVar2 = std::operator<<(poVar2," error: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    local_8a1 = 1;
    this_00 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(this_00,in_stack_fffffffffffff518);
    local_8a1 = 0;
    __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
  }
  iVar1 = pthread_create((pthread_t *)(in_RDI + 1),(pthread_attr_t *)0x0,Run,in_RDI);
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_a30);
    message = (string *)std::operator<<(local_a20,"Cannot start thread: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<((ostream *)message,pcVar4);
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffff520,message);
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  *(undefined1 *)&in_RDI[0xc]._vptr_ILogger = 1;
  return;
}

Assistant:

LogTcpServer::LogTcpServer(int port) :
	m_port(port),
	m_acceptfd(-1),
	m_running(false)
{
	m_ctlfd[0] = -1;
	m_ctlfd[1] = -1;
	try
	{
		if (pthread_mutex_init(&m_mutex, NULL) != 0)
			abort();

		m_acceptfd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
		if (m_acceptfd < 0)
		{
			std::stringstream ss;
			ss << "Cannot create socket: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		if (socketpair(AF_LOCAL, SOCK_STREAM, 0, m_ctlfd) != 0)
		{
			std::stringstream ss;
			ss << "Cannot create ctlfd: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Set SO_REUSEADDR so re can rebind on a port
		int value = 1;
		socklen_t vallen(sizeof(value));
		if (setsockopt(m_acceptfd, SOL_SOCKET, SO_REUSEADDR, &value, vallen) < 0)
		{
			std::stringstream ss;
			ss << "Cannot set SO_REUSEADDR on socket: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Bind etc..
		struct sockaddr_in serv_addr;
		socklen_t sockaddr_len = sizeof(serv_addr);
		memset(&serv_addr, 0, sizeof(serv_addr));
		serv_addr.sin_family = AF_INET;
		serv_addr.sin_addr.s_addr = INADDR_ANY;
		serv_addr.sin_port = htons(m_port);
		if (bind(m_acceptfd, (struct sockaddr *) &serv_addr, sockaddr_len) < 0)
		{
			std::stringstream ss;
			ss << "Cannot bind to port: " << m_port << " error: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		if (listen(m_acceptfd, 15) < 0)
		{
			std::stringstream ss;
			ss << "Cannot listen on port: " << m_port << " error: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Create thread
		if (pthread_create(&m_thread, NULL, LogTcpServer::Run, this) != 0)
		{
			std::stringstream ss;
			ss << "Cannot start thread: " << strerror(errno);
			throw(LogException(ss.str()));
		}
		m_running = true;

	} catch(std::exception &ex)
	{
		if (m_acceptfd >= 0)
		{
			if (close(m_acceptfd) < 0)
			{
				abort();
			}
		}

		if (m_ctlfd[0] >= 0)
		{
			if (close(m_ctlfd[0]) < 0)
			{
				abort();
			}
		}

		if (m_ctlfd[1] >= 0)
		{
			if (close(m_ctlfd[1]) < 0)
			{
				abort();
			}
		}

		throw(ex);
	}
}